

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O0

void __thiscall wasm::BinaryInstWriter::visitSIMDReplace(BinaryInstWriter *this,SIMDReplace *curr)

{
  BufferWithRandomAccess *pBVar1;
  U32LEB local_34;
  U32LEB local_30;
  U32LEB local_2c;
  U32LEB local_28;
  U32LEB local_24;
  U32LEB local_20;
  U32LEB local_1c;
  SIMDReplace *local_18;
  SIMDReplace *curr_local;
  BinaryInstWriter *this_local;
  
  local_18 = curr;
  curr_local = (SIMDReplace *)this;
  BufferWithRandomAccess::operator<<(this->o,-3);
  switch(local_18->op) {
  case ReplaceLaneVecI8x16:
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_1c,0x17);
    BufferWithRandomAccess::operator<<(pBVar1,local_1c);
    break;
  case ReplaceLaneVecI16x8:
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_20,0x1a);
    BufferWithRandomAccess::operator<<(pBVar1,local_20);
    break;
  case ReplaceLaneVecI32x4:
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_24,0x1c);
    BufferWithRandomAccess::operator<<(pBVar1,local_24);
    break;
  case ReplaceLaneVecI64x2:
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_28,0x1e);
    BufferWithRandomAccess::operator<<(pBVar1,local_28);
    break;
  case ReplaceLaneVecF16x8:
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_2c,0x122);
    BufferWithRandomAccess::operator<<(pBVar1,local_2c);
    break;
  case ReplaceLaneVecF32x4:
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_30,0x20);
    BufferWithRandomAccess::operator<<(pBVar1,local_30);
    break;
  case ReplaceLaneVecF64x2:
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_34,0x22);
    BufferWithRandomAccess::operator<<(pBVar1,local_34);
  }
  if (0xf < local_18->index) {
    __assert_fail("curr->index < 16",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                  ,0x277,"void wasm::BinaryInstWriter::visitSIMDReplace(SIMDReplace *)");
  }
  BufferWithRandomAccess::operator<<(this->o,local_18->index);
  return;
}

Assistant:

void BinaryInstWriter::visitSIMDReplace(SIMDReplace* curr) {
  o << int8_t(BinaryConsts::SIMDPrefix);
  switch (curr->op) {
    case ReplaceLaneVecI8x16:
      o << U32LEB(BinaryConsts::I8x16ReplaceLane);
      break;
    case ReplaceLaneVecI16x8:
      o << U32LEB(BinaryConsts::I16x8ReplaceLane);
      break;
    case ReplaceLaneVecI32x4:
      o << U32LEB(BinaryConsts::I32x4ReplaceLane);
      break;
    case ReplaceLaneVecI64x2:
      o << U32LEB(BinaryConsts::I64x2ReplaceLane);
      break;
    case ReplaceLaneVecF16x8:
      o << U32LEB(BinaryConsts::F16x8ReplaceLane);
      break;
    case ReplaceLaneVecF32x4:
      o << U32LEB(BinaryConsts::F32x4ReplaceLane);
      break;
    case ReplaceLaneVecF64x2:
      o << U32LEB(BinaryConsts::F64x2ReplaceLane);
      break;
  }
  assert(curr->index < 16);
  o << uint8_t(curr->index);
}